

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O2

double getExpection(TRIPLERGB **mrx,int h,int w,int component,int y,int x)

{
  byte bVar1;
  int j;
  int j_00;
  int i;
  int i_00;
  undefined8 local_40;
  
  local_40 = 0.0;
  for (i_00 = y; j_00 = x, i_00 < h; i_00 = i_00 + 1) {
    for (; j_00 < w; j_00 = j_00 + 1) {
      bVar1 = getComponent((TRIPLEBYTES **)mrx,i_00,j_00,component);
      local_40 = local_40 + (double)bVar1;
    }
  }
  return local_40 / (double)((w - x) * (h - y));
}

Assistant:

double getExpection(TRIPLERGB **mrx, int h, int w, int component, int y, int x) {
    double count = 0;
    for (int i = y; i < h; i++) {
        for (int j = x; j < w; j++) {
            count += getComponent((TRIPLEBYTES **) mrx, i, j, component);
        }
    }
    return (count / ((h - y) * (w - x)));
}